

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          string_view fileSetType,string_view description,Action action)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  int iVar4;
  iterator iVar5;
  _Base_ptr __n;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  size_type local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  _Base_ptr local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  __n = (_Base_ptr)fileSetType._M_len;
  local_e0 = value;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
          ::find(&(((self->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets)._M_t
                 ,fileSetName);
  if (iVar5._M_node ==
      (_Base_ptr)
      ((long)&((self->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets + 8U)) {
    pcVar2 = this->Makefile;
    local_a8.first._M_len = description._M_len;
    local_a8.first._M_str = description._M_str;
    local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90 = 0x19;
    local_88 = "has not yet been created.";
    local_80 = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_a8;
    cmCatViews(&local_100,views_00);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_100);
  }
  else {
    if ((iVar5._M_node[3]._M_left == __n) &&
       ((__n == (_Base_ptr)0x0 ||
        (iVar4 = bcmp(iVar5._M_node[3]._M_parent,fileSetType._M_str,(size_t)__n), iVar4 == 0)))) {
      if (local_e0->_M_string_length == 0) {
        return;
      }
      pcVar3 = (local_e0->_M_dataplus)._M_p;
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,pcVar3,pcVar3 + local_e0->_M_string_length);
      cmMakefile::GetBacktrace(this->Makefile);
      paVar1 = &local_d8.Value.field_2;
      if (local_138 == &local_128) {
        local_d8.Value.field_2._8_8_ = local_128._8_8_;
        local_d8.Value._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d8.Value._M_dataplus._M_p = (pointer)local_138;
      }
      local_d8.Value.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
      local_d8.Value.field_2._M_local_buf[0] = local_128._M_local_buf[0];
      local_d8.Value._M_string_length = local_130;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_118;
      local_d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Stack_110;
      local_118 = (element_type *)0x0;
      p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_138 = &local_128;
      cmFileSet::AddDirectoryEntry((cmFileSet *)(iVar5._M_node + 2),&local_d8);
      if (local_d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.Value._M_dataplus._M_p,
                        local_d8.Value.field_2._M_allocated_capacity + 1);
      }
      if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
      }
      if (local_138 == &local_128) {
        return;
      }
      local_100.field_2._M_allocated_capacity =
           CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]);
      local_100._M_dataplus._M_p = (pointer)local_138;
      goto LAB_002e8935;
    }
    pcVar2 = this->Makefile;
    local_a8.first._M_len = 10;
    local_a8.first._M_str = "File set \"";
    local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = (fileSetName->_M_dataplus)._M_p;
    local_90 = fileSetName->_M_string_length;
    local_80 = 0;
    local_78 = 0x12;
    local_70 = "\" is not of type \"";
    local_68 = 0;
    local_50 = 0;
    local_48 = 2;
    local_40 = "\".";
    local_38 = 0;
    views._M_len = 5;
    views._M_array = &local_a8;
    local_60 = __n;
    local_58 = fileSetType._M_str;
    cmCatViews(&local_100,views);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p == &local_100.field_2) {
    return;
  }
LAB_002e8935:
  operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmTargetInternals::AddDirectoryToFileSet(cmTarget* self,
                                              std::string const& fileSetName,
                                              ValueType value,
                                              cm::string_view fileSetType,
                                              cm::string_view description,
                                              FileSetType::Action action)
{
  auto* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(description, "has not yet been created."));
    return;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return;
  }
  if (action == FileSetType::Action::Set) {
    fileSet->ClearDirectoryEntries();
  }
  if (cmNonempty(value)) {
    fileSet->AddDirectoryEntry(
      BT<std::string>(value, this->Makefile->GetBacktrace()));
  }
}